

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsCore.c
# Opt level: O3

void Abc_NtkMfsPowerResub(Mfs_Man_t *p,Mfs_Par_t *pPars)

{
  uint uVar1;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  long lVar8;
  
  pNtk = p->pNtk;
  iVar4 = Abc_NtkGetFaninMax(pNtk);
  pVVar6 = pNtk->vObjs;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar6->pArray[lVar8];
      if ((((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) &&
          ((iVar5 = p->pPars->nDepthMax, iVar5 == 0 ||
           ((int)(*(uint *)&pAVar2->field_0x14 >> 0xc) <= iVar5)))) &&
         (iVar5 = (pAVar2->vFanins).nSize, iVar5 <= iVar4 && 1 < iVar5)) {
        iVar5 = Abc_WinNode(p,pAVar2);
        if (iVar5 == 0) {
          iVar5 = (pAVar2->vFanins).nSize;
          if (0 < iVar5) {
            lVar7 = 0;
            do {
              pVVar3 = p->vProbs;
              if (pVVar3 != (Vec_Int_t *)0x0) {
                uVar1 = *(uint *)((long)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar7]]
                                 + 0x10);
                if ((int)uVar1 < pVVar3->nSize) {
                  if ((int)uVar1 < 0) goto LAB_00466f47;
                  if (0.35 <= (float)pVVar3->pArray[uVar1]) {
                    Abc_NtkMfsSolveSatResub(p,pAVar2,(int)lVar7,0,0);
                    iVar5 = (pAVar2->vFanins).nSize;
                  }
                }
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < iVar5);
          }
        }
      }
      lVar8 = lVar8 + 1;
      pVVar6 = pNtk->vObjs;
    } while (lVar8 < pVVar6->nSize);
    if (0 < pVVar6->nSize) {
      lVar8 = 0;
      do {
        pAVar2 = (Abc_Obj_t *)pVVar6->pArray[lVar8];
        if ((((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) &&
            ((iVar5 = p->pPars->nDepthMax, iVar5 == 0 ||
             ((int)(*(uint *)&pAVar2->field_0x14 >> 0xc) <= iVar5)))) &&
           (iVar5 = (pAVar2->vFanins).nSize, iVar5 <= iVar4 && 1 < iVar5)) {
          iVar5 = Abc_WinNode(p,pAVar2);
          if (iVar5 == 0) {
            iVar5 = (pAVar2->vFanins).nSize;
            if (0 < iVar5) {
              lVar7 = 0;
              do {
                pVVar3 = p->vProbs;
                if (pVVar3 != (Vec_Int_t *)0x0) {
                  uVar1 = *(uint *)((long)pAVar2->pNtk->vObjs->pArray
                                          [(pAVar2->vFanins).pArray[lVar7]] + 0x10);
                  if ((int)uVar1 < pVVar3->nSize) {
                    if ((int)uVar1 < 0) goto LAB_00466f47;
                    if (0.35 <= (float)pVVar3->pArray[uVar1]) {
                      Abc_NtkMfsSolveSatResub(p,pAVar2,(int)lVar7,0,0);
                      iVar5 = (pAVar2->vFanins).nSize;
                    }
                  }
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < iVar5);
            }
          }
        }
        lVar8 = lVar8 + 1;
        pVVar6 = pNtk->vObjs;
      } while (lVar8 < pVVar6->nSize);
      if (0 < pVVar6->nSize) {
        lVar8 = 0;
        do {
          pAVar2 = (Abc_Obj_t *)pVVar6->pArray[lVar8];
          if ((((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) &&
              ((iVar5 = p->pPars->nDepthMax, iVar5 == 0 ||
               ((int)(*(uint *)&pAVar2->field_0x14 >> 0xc) <= iVar5)))) &&
             (iVar5 = (pAVar2->vFanins).nSize, iVar5 <= iVar4 && 1 < iVar5)) {
            iVar5 = Abc_WinNode(p,pAVar2);
            if (iVar5 == 0) {
              iVar5 = (pAVar2->vFanins).nSize;
              if (0 < iVar5) {
                lVar7 = 0;
                do {
                  pVVar3 = p->vProbs;
                  if (pVVar3 != (Vec_Int_t *)0x0) {
                    uVar1 = *(uint *)((long)pAVar2->pNtk->vObjs->pArray
                                            [(pAVar2->vFanins).pArray[lVar7]] + 0x10);
                    if ((int)uVar1 < pVVar3->nSize) {
                      if ((int)uVar1 < 0) {
LAB_00466f47:
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                      }
                      if (0.2 <= (float)pVVar3->pArray[uVar1]) {
                        Abc_NtkMfsSolveSatResub(p,pAVar2,(int)lVar7,1,0);
                        iVar5 = (pAVar2->vFanins).nSize;
                      }
                    }
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar7 < iVar5);
              }
            }
          }
          lVar8 = lVar8 + 1;
          pVVar6 = pNtk->vObjs;
        } while (lVar8 < pVVar6->nSize);
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkMfsPowerResub( Mfs_Man_t * p, Mfs_Par_t * pPars)
{
	int i, k;
	Abc_Obj_t *pFanin, *pNode;
	Abc_Ntk_t *pNtk = p->pNtk;
	int nFaninMax = Abc_NtkGetFaninMax(p->pNtk);

	Abc_NtkForEachNode( pNtk, pNode, k )
	{
		if ( p->pPars->nDepthMax && (int)pNode->Level > p->pPars->nDepthMax )
			continue;
		if ( Abc_ObjFaninNum(pNode) < 2 || Abc_ObjFaninNum(pNode) > nFaninMax )
			continue;
		if (Abc_WinNode(p, pNode) )  // something wrong
			continue;

		// solve the SAT problem
		// Abc_NtkMfsEdgePower( p, pNode );
		// try replacing area critical fanins
		Abc_ObjForEachFanin( pNode, pFanin, i )
			if ( Abc_MfsObjProb(p, pFanin) >= 0.35 && Abc_NtkMfsSolveSatResub( p, pNode, i, 0, 0 ) )
				continue;
	}

	Abc_NtkForEachNode( pNtk, pNode, k )
	{
		if ( p->pPars->nDepthMax && (int)pNode->Level > p->pPars->nDepthMax )
			continue;
		if ( Abc_ObjFaninNum(pNode) < 2 || Abc_ObjFaninNum(pNode) > nFaninMax )
			continue;
		if (Abc_WinNode(p, pNode) )  // something wrong
			continue;

		// solve the SAT problem
		// Abc_NtkMfsEdgePower( p, pNode );
		// try replacing area critical fanins
		Abc_ObjForEachFanin( pNode, pFanin, i )
			if ( Abc_MfsObjProb(p, pFanin) >= 0.35 && Abc_NtkMfsSolveSatResub( p, pNode, i, 0, 0 ) )
				continue;
	}

	Abc_NtkForEachNode( pNtk, pNode, k )
	{
		if ( p->pPars->nDepthMax && (int)pNode->Level > p->pPars->nDepthMax )
			continue;
		if ( Abc_ObjFaninNum(pNode) < 2 || Abc_ObjFaninNum(pNode) > nFaninMax )
			continue;
		if (Abc_WinNode(p, pNode) ) // something wrong
			continue;

		Abc_ObjForEachFanin( pNode, pFanin, i )
			if ( Abc_MfsObjProb(p, pFanin) >= 0.2 && Abc_NtkMfsSolveSatResub( p, pNode, i, 1, 0 ) )
				continue;
	}
/*
	Abc_NtkForEachNode( pNtk, pNode, k )
	{
		if ( p->pPars->nDepthMax && (int)pNode->Level > p->pPars->nDepthMax )
			continue;
		if ( Abc_ObjFaninNum(pNode) < 2 || Abc_ObjFaninNum(pNode) > nFaninMax - 2)
			continue;
		if (Abc_WinNode(p, pNode) ) // something wrong
			continue;

		Abc_ObjForEachFanin( pNode, pFanin, i )
			if ( Abc_MfsObjProb(p, pFanin) >= 0.37 && Abc_NtkMfsSolveSatResub2( p, pNode, i, -1 ) )
				continue;
	}
*/
}